

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O0

Node * __thiscall itis::SplayTree::search(SplayTree *this,int x)

{
  Node *local_30;
  Node *prev;
  Node *curr;
  Node *ret;
  int x_local;
  SplayTree *this_local;
  
  curr = (Node *)0x0;
  prev = this->root;
  local_30 = (Node *)0x0;
LAB_0010575e:
  do {
    if (prev == (Node *)0x0) {
LAB_001057ad:
      if (curr == (Node *)0x0) {
        if (local_30 != (Node *)0x0) {
          splay(this,local_30);
        }
      }
      else {
        splay(this,curr);
      }
      return curr;
    }
    local_30 = prev;
    if (x < prev->data) {
      prev = prev->left_child;
      goto LAB_0010575e;
    }
    if (x <= prev->data) {
      curr = prev;
      goto LAB_001057ad;
    }
    prev = prev->right_child;
  } while( true );
}

Assistant:

Node *SplayTree::search(int x) {
    Node *ret = nullptr;
    Node *curr = this->root;
    Node *prev = nullptr;
    while (curr != nullptr) {
      prev = curr;
      if (x < curr->data) {
        curr = curr->left_child;
      } else if (x > curr->data) {
        curr = curr->right_child;
      } else {
        ret = curr;
        break;
      }
    }
    if (ret != nullptr) {
      splay(ret);
    } else if (prev != nullptr) {
      splay(prev);
    }
    return ret;
  }